

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O2

Dim * __thiscall
cnn::AffineTransform::dim_forward
          (Dim *__return_storage_ptr__,AffineTransform *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  pointer pDVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  ostream *poVar6;
  invalid_argument *piVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  string local_1b0 [32];
  ostringstream s;
  
  pDVar1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pDVar1) / 0x24;
  if ((uVar5 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
    poVar6 = std::operator<<((ostream *)&s,"Bad number of inputs in AffineTransform: ");
    operator<<(poVar6,xs);
    piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::invalid_argument::invalid_argument(piVar7,local_1b0);
    __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  uVar9 = pDVar1->bd;
  __return_storage_ptr__->bd = uVar9;
  uVar2 = *(undefined8 *)pDVar1->d;
  uVar3 = *(undefined8 *)(pDVar1->d + 2);
  uVar4 = *(undefined8 *)(pDVar1->d + 6);
  *(undefined8 *)(__return_storage_ptr__->d + 4) = *(undefined8 *)(pDVar1->d + 4);
  *(undefined8 *)(__return_storage_ptr__->d + 6) = uVar4;
  *(undefined8 *)__return_storage_ptr__->d = uVar2;
  *(undefined8 *)(__return_storage_ptr__->d + 2) = uVar3;
  uVar8 = 2;
  while( true ) {
    uVar10 = (ulong)(uVar8 - 1);
    if (uVar5 <= uVar10) {
      __return_storage_ptr__->bd = uVar9;
      return __return_storage_ptr__;
    }
    uVar11 = 1;
    uVar12 = uVar11;
    if (1 < pDVar1[uVar10].nd) {
      uVar12 = pDVar1[uVar10].d[1];
    }
    if ((uVar12 != pDVar1[uVar8].d[0]) || (pDVar1->d[0] != pDVar1[uVar10].d[0])) break;
    uVar12 = uVar11;
    if (1 < pDVar1->nd) {
      uVar12 = pDVar1->d[1];
    }
    if (1 < pDVar1[uVar8].nd) {
      uVar11 = pDVar1[uVar8].d[1];
    }
    if (uVar12 != uVar11) break;
    uVar12 = pDVar1[uVar10].bd;
    if (uVar12 < uVar9) {
      uVar12 = uVar9;
    }
    uVar9 = uVar12;
    if (uVar12 <= pDVar1[uVar8].bd) {
      uVar9 = pDVar1[uVar8].bd;
    }
    uVar8 = uVar8 + 2;
  }
  __return_storage_ptr__->bd = uVar9;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
  poVar6 = std::operator<<((ostream *)&s,"Bad dimensions for AffineTransform: ");
  operator<<(poVar6,xs);
  piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(piVar7,local_1b0);
  __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim AffineTransform::dim_forward(const vector<Dim>& xs) const {
  if ((xs.size() - 1) % 2 != 0) {
    ostringstream s; s << "Bad number of inputs in AffineTransform: " << xs;
    throw std::invalid_argument(s.str());
  }
  Dim d = xs[0];
  for (unsigned i = 1; i < xs.size(); i += 2) {
    if (xs[i].cols() != xs[i+1].rows() ||
        xs[0].rows() != xs[i].rows() ||
        xs[0].cols() != xs[i+1].cols()) {
      ostringstream s; s << "Bad dimensions for AffineTransform: " << xs;
      throw std::invalid_argument(s.str());
    }
    d.bd = max(max(d.bd, xs[i].bd), xs[i+1].bd);
  }
  return d;
}